

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  FILE *key;
  AssertHelper *this_01;
  AssertionResult *assertion_result;
  value_type actual_predicate_value;
  key_type expected_predicate_value;
  size_type sVar2;
  AssertHelper *this_02;
  reference ppcVar3;
  key_type pcVar4;
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_03;
  AssertionResult *this_04;
  long in_RDI;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  TypeParam ht_in;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  int i;
  TypeParam ht_out;
  undefined4 in_stack_fffffffffffff948;
  int in_stack_fffffffffffff94c;
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff950;
  key_equal *in_stack_fffffffffffff958;
  int index;
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff960;
  char *in_stack_fffffffffffff968;
  int iVar5;
  HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff970;
  undefined8 in_stack_fffffffffffff978;
  Type TVar6;
  AssertHelper *in_stack_fffffffffffff980;
  char *in_stack_fffffffffffff9b0;
  char *in_stack_fffffffffffff9b8;
  char *in_stack_fffffffffffff9c0;
  AssertionResult *in_stack_fffffffffffff9c8;
  AssertHelper *in_stack_fffffffffffff9d0;
  string local_5c0 [48];
  key_type local_590;
  undefined1 local_581;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffa88;
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa90;
  AssertionResult local_530 [2];
  AssertHelper *local_510;
  value_type local_4b8;
  AssertionResult local_4b0;
  string local_4a0 [48];
  key_type local_470;
  undefined1 local_461;
  AssertionResult local_460 [2];
  key_type local_440;
  value_type local_3e8;
  AssertionResult local_3e0 [2];
  AssertHelper *local_3c0;
  value_type local_368;
  AssertionResult local_360;
  string local_350 [55];
  undefined1 local_319;
  AssertionResult local_318;
  string local_308 [55];
  undefined1 local_2d1;
  AssertionResult local_2d0;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_2c0;
  Hasher local_2b0;
  Hasher local_2a4;
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  local_298;
  string local_1f8 [55];
  undefined1 local_1c1;
  AssertionResult local_1c0;
  string local_1b0 [55];
  undefined1 local_179;
  AssertionResult local_178;
  FILE *local_168;
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_160;
  key_type local_158;
  value_type local_f8;
  int local_ec;
  key_type local_e8;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_d0;
  Hasher local_c0;
  Hasher local_b4;
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  local_a8;
  
  bVar1 = google::
          HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    Hasher::Hasher(&local_b4,0);
    Hasher::Hasher(&local_c0,0);
    Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_d0,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashSet
              (in_stack_fffffffffffff970,(size_type)in_stack_fffffffffffff968,
               (hasher *)in_stack_fffffffffffff960,in_stack_fffffffffffff958,
               (allocator_type *)in_stack_fffffffffffff950);
    Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d0);
    local_e8 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffff960,(int)((ulong)in_stack_fffffffffffff958 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff950,
                      (key_type *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
    for (local_ec = 1; TVar6 = (Type)((ulong)in_stack_fffffffffffff978 >> 0x20), local_ec < 100;
        local_ec = local_ec + 1) {
      local_f8 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
      google::
      BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffa90,(value_type *)in_stack_fffffffffffffa88._M_head_impl);
    }
    local_158 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff960,
                            (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffff950,
            (key_type *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
    this_00 = (BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               *)HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueKey(in_stack_fffffffffffff960,
                             (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
    local_160 = this_00;
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffff950,
            (key_type *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
    key = tmpfile();
    local_179 = key != (FILE *)0x0;
    local_168 = key;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff950,
               (bool *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
               (type *)0xf4575b);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff980);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                 in_stack_fffffffffffff9b0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff980,TVar6,(char *)in_stack_fffffffffffff970,
                 (int)((ulong)in_stack_fffffffffffff968 >> 0x20),(char *)in_stack_fffffffffffff960);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff9d0,(Message *)in_stack_fffffffffffff9c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
      std::__cxx11::string::~string(local_1b0);
      testing::Message::~Message((Message *)0xf4581e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf458b2);
    local_1c1 = google::
                BaseHashtableInterface<google::sparse_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>>
                ::serialize<ValueSerializer,_IO_FILE>(&local_a8,local_168);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff950,
               (bool *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
               (type *)0xf458f9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff980);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                 in_stack_fffffffffffff9b0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff980,TVar6,(char *)in_stack_fffffffffffff970,
                 (int)((ulong)in_stack_fffffffffffff968 >> 0x20),(char *)in_stack_fffffffffffff960);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff9d0,(Message *)in_stack_fffffffffffff9c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
      std::__cxx11::string::~string(local_1f8);
      testing::Message::~Message((Message *)0xf459ce);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf45a65);
    rewind(local_168);
    Hasher::Hasher(&local_2a4,0);
    Hasher::Hasher(&local_2b0,0);
    Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_2c0,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashSet
              (in_stack_fffffffffffff970,(size_type)in_stack_fffffffffffff968,
               (hasher *)in_stack_fffffffffffff960,in_stack_fffffffffffff958,
               (allocator_type *)in_stack_fffffffffffff950);
    Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_2c0);
    local_2d1 = local_168 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff950,
               (bool *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
               (type *)0xf45b0d);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff980);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                 in_stack_fffffffffffff9b0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff980,TVar6,(char *)in_stack_fffffffffffff970,
                 (int)((ulong)in_stack_fffffffffffff968 >> 0x20),(char *)in_stack_fffffffffffff960);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff9d0,(Message *)in_stack_fffffffffffff9c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
      std::__cxx11::string::~string(local_308);
      testing::Message::~Message((Message *)0xf45c21);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf45cb5);
    local_319 = google::
                BaseHashtableInterface<google::sparse_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>>
                ::unserialize<ValueSerializer,_IO_FILE>(&local_298,local_168);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff950,
               (bool *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
               (type *)0xf45cfc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_318);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff980);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                 in_stack_fffffffffffff9b0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff980,TVar6,(char *)in_stack_fffffffffffff970,
                 (int)((ulong)in_stack_fffffffffffff968 >> 0x20),(char *)in_stack_fffffffffffff960);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff9d0,(Message *)in_stack_fffffffffffff9c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
      std::__cxx11::string::~string(local_350);
      testing::Message::~Message((Message *)0xf45dd1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf45e68);
    fclose(local_168);
    local_368 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
    this_01 = (AssertHelper *)
              HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff960,(int)((ulong)in_stack_fffffffffffff958 >> 0x20))
    ;
    local_3c0 = this_01;
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(this_00,(key_type *)key);
    assertion_result =
         (AssertionResult *)
         google::
         sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         ::operator*((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                      *)0xf45efb);
    testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
              (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,
               (char **)in_stack_fffffffffffff958,(char **)in_stack_fffffffffffff950);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_360);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff980);
      in_stack_fffffffffffff9c0 =
           testing::AssertionResult::failure_message((AssertionResult *)0xf45f78);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff980,TVar6,(char *)in_stack_fffffffffffff970,
                 (int)((ulong)in_stack_fffffffffffff968 >> 0x20),(char *)in_stack_fffffffffffff960);
      testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
      testing::Message::~Message((Message *)0xf45fd5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf46046);
    actual_predicate_value =
         HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
    local_3e8 = actual_predicate_value;
    expected_predicate_value =
         HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(in_stack_fffffffffffff960,(int)((ulong)in_stack_fffffffffffff958 >> 0x20));
    local_440 = expected_predicate_value;
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(this_00,(key_type *)key);
    google::
    sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf460be);
    testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
              (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,
               (char **)in_stack_fffffffffffff958,(char **)in_stack_fffffffffffff950);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3e0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff980);
      testing::AssertionResult::failure_message((AssertionResult *)0xf46135);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff980,TVar6,(char *)in_stack_fffffffffffff970,
                 (int)((ulong)in_stack_fffffffffffff968 >> 0x20),(char *)in_stack_fffffffffffff960);
      testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
      testing::Message::~Message((Message *)0xf46192);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf46203);
    local_470 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff960,
                            (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
    sVar2 = google::
            BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff950,
                    (key_type *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
    local_461 = sVar2 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff950,
               (bool *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
               (type *)0xf4626e);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_460);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff980);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,in_stack_fffffffffffff9c0,actual_predicate_value,
                 expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff980,TVar6,(char *)in_stack_fffffffffffff970,
                 (int)((ulong)in_stack_fffffffffffff968 >> 0x20),(char *)in_stack_fffffffffffff960);
      testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
      std::__cxx11::string::~string(local_4a0);
      testing::Message::~Message((Message *)0xf46343);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf463da);
    local_4b8 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff950,in_stack_fffffffffffff94c);
    this_02 = (AssertHelper *)
              HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff960,(int)((ulong)in_stack_fffffffffffff958 >> 0x20))
    ;
    local_510 = this_02;
    google::
    BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(this_00,(key_type *)key);
    ppcVar3 = google::
              sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator*((sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                           *)0xf46452);
    TVar6 = (Type)((ulong)ppcVar3 >> 0x20);
    testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
              (in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960,
               (char **)in_stack_fffffffffffff958,(char **)in_stack_fffffffffffff950);
    index = (int)((ulong)in_stack_fffffffffffff958 >> 0x20);
    iVar5 = (int)((ulong)in_stack_fffffffffffff968 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4b0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_02);
      in_stack_fffffffffffff970 =
           (HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xf464c9);
      testing::internal::AssertHelper::AssertHelper
                (this_02,TVar6,(char *)in_stack_fffffffffffff970,iVar5,
                 (char *)in_stack_fffffffffffff960);
      testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
      testing::Message::~Message((Message *)0xf46526);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf46597);
    pcVar4 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffff960,index);
    iVar5 = (int)((ulong)pcVar4 >> 0x20);
    this_03 = (HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               *)google::
                 BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 ::count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                          *)in_stack_fffffffffffff950,
                         (key_type *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff950,
               (bool *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
               (type *)0xf46602);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_530);
    if (!bVar1) {
      testing::Message::Message((Message *)this_02);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,in_stack_fffffffffffff9c0,actual_predicate_value,
                 expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_02,TVar6,(char *)in_stack_fffffffffffff970,iVar5,(char *)this_03);
      testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff950);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffa90);
      testing::Message::~Message((Message *)0xf466d7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf4676e);
    local_590 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(this_03,index);
    this_04 = (AssertionResult *)
              google::
              BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff950,
                      (key_type *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
    local_581 = this_04 == (AssertionResult *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (this_04,(bool *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
               (type *)0xf467d9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffa80);
    if (!bVar1) {
      testing::Message::Message((Message *)this_02);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (assertion_result,in_stack_fffffffffffff9c0,actual_predicate_value,
                 expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_02,TVar6,(char *)in_stack_fffffffffffff970,iVar5,(char *)this_03);
      testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
      std::__cxx11::string::~string(local_5c0);
      testing::Message::~Message((Message *)0xf468ae);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf46942);
    google::
    HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashSet
              ((HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)0xf4694f);
    google::
    HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashSet
              ((HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)0xf4695c);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Serialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(ValueSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(ValueSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}